

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_2str.c
# Opt level: O0

char * strof_rc_mode(MppEncRcMode rc_mode)

{
  char *pcStack_10;
  MppEncRcMode rc_mode_local;
  
  if (rc_mode < MPP_ENC_RC_MODE_BUTT) {
    pcStack_10 = strof_rc_mode::rc_mode_str[rc_mode];
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *strof_rc_mode(MppEncRcMode rc_mode)
{
    static const char *rc_mode_str[] = {
        "vbr",
        "cbr",
        "fixqp",
        "avbr",
        "smtrc"
    };

    if (rc_mode >= MPP_ENC_RC_MODE_VBR && rc_mode < MPP_ENC_RC_MODE_BUTT)
        return rc_mode_str[rc_mode];

    return NULL;
}